

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O0

void duckdb_zstd::ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t *ms,BYTE *ip)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  size_t sVar7;
  byte bVar8;
  int in_ESI;
  long in_RDI;
  U32 i_2;
  U32 h_1;
  U32 i_1;
  U32 chainPackedPointer;
  U32 bucketIdx;
  U32 i;
  U32 countBeyondMinChain;
  U32 count;
  U32 chainPos;
  U32 h;
  U32 hashIdx;
  U32 tmpMinChain;
  U32 tmpChainSize;
  U32 *tmpChainTable;
  U32 *tmpHashTable;
  U32 hashLog;
  U32 chainLimit;
  U32 chainAttempts;
  U32 cacheSize;
  U32 bucketSize;
  U32 minChain;
  U32 idx;
  U32 chainSize;
  U32 *chainTable;
  U32 *hashTable;
  U32 target;
  BYTE *base;
  undefined8 in_stack_ffffffffffffff18;
  U32 h_00;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  int local_c4;
  uint local_bc;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_9c;
  uint local_68;
  int local_20;
  ulong local_8;
  
  uVar4 = in_ESI - (int)*(undefined8 *)(in_RDI + 8);
  lVar2 = *(long *)(in_RDI + 0x70);
  lVar3 = *(long *)(in_RDI + 0x80);
  uVar5 = 1 << ((byte)*(undefined4 *)(in_RDI + 0x104) & 0x1f);
  local_68 = *(uint *)(in_RDI + 0x2c);
  local_c8 = local_68;
  if (uVar5 < uVar4 - local_68) {
    local_c8 = uVar4 - uVar5;
  }
  local_cc = (1 << ((byte)*(undefined4 *)(in_RDI + 0x10c) & 0x1f)) - 3;
  if (0xff < local_cc) {
    local_cc = 0xff;
  }
  bVar8 = (char)*(undefined4 *)(in_RDI + 0x108) - 2;
  lVar6 = lVar2 + (1L << (bVar8 & 0x3f)) * 4;
  uVar5 = 3 << (bVar8 & 0x1f);
  local_d0 = local_68;
  if (uVar5 < uVar4) {
    local_d0 = uVar4 - uVar5;
  }
  for (; local_68 < uVar4; local_68 = local_68 + 1) {
    h_00 = (U32)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    switch(*(undefined4 *)(in_RDI + 0x110)) {
    default:
      local_8 = ZSTD_hash4Ptr((void *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                              h_00);
      break;
    case 5:
      local_8 = ZSTD_hash5Ptr((void *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                              h_00);
      break;
    case 6:
      local_8 = ZSTD_hash6Ptr((void *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                              h_00);
      break;
    case 7:
      local_8 = ZSTD_hash7Ptr((void *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                              h_00);
      break;
    case 8:
      local_8 = ZSTD_hash8Ptr((void *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                              h_00);
    }
    if (local_d0 <= local_68) {
      *(undefined4 *)(lVar6 + (ulong)(local_68 - local_d0) * 4) =
           *(undefined4 *)(lVar2 + (local_8 & 0xffffffff) * 4);
    }
    *(uint *)(lVar2 + (local_8 & 0xffffffff) * 4) = local_68;
  }
  local_a4 = 0;
  local_9c = 0;
  do {
    if ((uint)(1 << (bVar8 & 0x1f)) <= local_9c) {
      local_9c = 1 << (bVar8 & 0x1f);
      while (local_9c != 0) {
        local_9c = local_9c - 1;
        uVar1 = *(undefined4 *)(lVar2 + (ulong)local_9c * 4);
        for (local_bc = 0; local_bc < 3; local_bc = local_bc + 1) {
          *(undefined4 *)(lVar2 + (ulong)(local_9c * 4 + local_bc) * 4) = 0;
        }
        *(undefined4 *)(lVar2 + (ulong)(local_9c * 4 + 3) * 4) = uVar1;
      }
      for (local_68 = *(uint *)(in_RDI + 0x2c); local_68 < uVar4; local_68 = local_68 + 1) {
        switch(*(undefined4 *)(in_RDI + 0x110)) {
        default:
          sVar7 = ZSTD_hash4Ptr((void *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20
                                                ),0);
          local_20 = (int)sVar7;
          break;
        case 5:
          sVar7 = ZSTD_hash5Ptr((void *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20
                                                ),0);
          local_20 = (int)sVar7;
          break;
        case 6:
          sVar7 = ZSTD_hash6Ptr((void *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20
                                                ),0);
          local_20 = (int)sVar7;
          break;
        case 7:
          sVar7 = ZSTD_hash7Ptr((void *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20
                                                ),0);
          local_20 = (int)sVar7;
          break;
        case 8:
          sVar7 = ZSTD_hash8Ptr((void *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20
                                                ),0);
          local_20 = (int)sVar7;
        }
        uVar5 = local_20 * 4;
        for (local_c4 = 2; local_c4 != 0; local_c4 = local_c4 + -1) {
          *(undefined4 *)(lVar2 + (ulong)(uVar5 + local_c4) * 4) =
               *(undefined4 *)(lVar2 + (ulong)((uVar5 + local_c4) - 1) * 4);
        }
        *(uint *)(lVar2 + (ulong)uVar5 * 4) = local_68;
      }
      *(uint *)(in_RDI + 0x2c) = uVar4;
      return;
    }
    local_ac = 0;
    local_b0 = *(uint *)(lVar2 + (ulong)local_9c * 4);
    local_a8 = 0;
    for (; in_stack_ffffffffffffff27 = local_d0 <= local_b0 && local_a8 < 3,
        local_d0 <= local_b0 && local_a8 < 3;
        local_b0 = *(uint *)(lVar6 + (ulong)(local_b0 - local_d0) * 4)) {
      if (local_b0 < local_c8) {
        local_ac = local_ac + 1;
      }
      local_a8 = local_a8 + 1;
    }
    if (local_a8 == 3) {
      local_a8 = 0;
      while ((local_a8 < local_cc &&
             ((local_c8 <= local_b0 || ((local_b0 != 0 && (local_ac = local_ac + 1, local_ac < 4))))
             ))) {
        uVar5 = local_a4 + 1;
        *(uint *)(lVar3 + (ulong)local_a4 * 4) = local_b0;
        local_a8 = local_a8 + 1;
        local_a4 = uVar5;
        if (local_b0 < local_d0) break;
        local_b0 = *(uint *)(lVar6 + (ulong)(local_b0 - local_d0) * 4);
      }
    }
    else {
      local_a8 = 0;
    }
    if (local_a8 == 0) {
      *(undefined4 *)(lVar2 + (ulong)local_9c * 4) = 0;
    }
    else {
      *(uint *)(lVar2 + (ulong)local_9c * 4) = local_a4 * 0x100 + local_a8 * -0xff;
    }
    local_9c = local_9c + 1;
  } while( true );
}

Assistant:

void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t* ms, const BYTE* const ip)
{
    const BYTE* const base = ms->window.base;
    U32 const target = (U32)(ip - base);
    U32* const hashTable = ms->hashTable;
    U32* const chainTable = ms->chainTable;
    U32 const chainSize = 1 << ms->cParams.chainLog;
    U32 idx = ms->nextToUpdate;
    U32 const minChain = chainSize < target - idx ? target - chainSize : idx;
    U32 const bucketSize = 1 << ZSTD_LAZY_DDSS_BUCKET_LOG;
    U32 const cacheSize = bucketSize - 1;
    U32 const chainAttempts = (1 << ms->cParams.searchLog) - cacheSize;
    U32 const chainLimit = chainAttempts > 255 ? 255 : chainAttempts;

    /* We know the hashtable is oversized by a factor of `bucketSize`.
     * We are going to temporarily pretend `bucketSize == 1`, keeping only a
     * single entry. We will use the rest of the space to construct a temporary
     * chaintable.
     */
    U32 const hashLog = ms->cParams.hashLog - ZSTD_LAZY_DDSS_BUCKET_LOG;
    U32* const tmpHashTable = hashTable;
    U32* const tmpChainTable = hashTable + ((size_t)1 << hashLog);
    U32 const tmpChainSize = (U32)((1 << ZSTD_LAZY_DDSS_BUCKET_LOG) - 1) << hashLog;
    U32 const tmpMinChain = tmpChainSize < target ? target - tmpChainSize : idx;
    U32 hashIdx;

    assert(ms->cParams.chainLog <= 24);
    assert(ms->cParams.hashLog > ms->cParams.chainLog);
    assert(idx != 0);
    assert(tmpMinChain <= minChain);

    /* fill conventional hash table and conventional chain table */
    for ( ; idx < target; idx++) {
        U32 const h = (U32)ZSTD_hashPtr(base + idx, hashLog, ms->cParams.minMatch);
        if (idx >= tmpMinChain) {
            tmpChainTable[idx - tmpMinChain] = hashTable[h];
        }
        tmpHashTable[h] = idx;
    }

    /* sort chains into ddss chain table */
    {
        U32 chainPos = 0;
        for (hashIdx = 0; hashIdx < (1U << hashLog); hashIdx++) {
            U32 count;
            U32 countBeyondMinChain = 0;
            U32 i = tmpHashTable[hashIdx];
            for (count = 0; i >= tmpMinChain && count < cacheSize; count++) {
                /* skip through the chain to the first position that won't be
                 * in the hash cache bucket */
                if (i < minChain) {
                    countBeyondMinChain++;
                }
                i = tmpChainTable[i - tmpMinChain];
            }
            if (count == cacheSize) {
                for (count = 0; count < chainLimit;) {
                    if (i < minChain) {
                        if (!i || ++countBeyondMinChain > cacheSize) {
                            /* only allow pulling `cacheSize` number of entries
                             * into the cache or chainTable beyond `minChain`,
                             * to replace the entries pulled out of the
                             * chainTable into the cache. This lets us reach
                             * back further without increasing the total number
                             * of entries in the chainTable, guaranteeing the
                             * DDSS chain table will fit into the space
                             * allocated for the regular one. */
                            break;
                        }
                    }
                    chainTable[chainPos++] = i;
                    count++;
                    if (i < tmpMinChain) {
                        break;
                    }
                    i = tmpChainTable[i - tmpMinChain];
                }
            } else {
                count = 0;
            }
            if (count) {
                tmpHashTable[hashIdx] = ((chainPos - count) << 8) + count;
            } else {
                tmpHashTable[hashIdx] = 0;
            }
        }
        assert(chainPos <= chainSize); /* I believe this is guaranteed... */
    }

    /* move chain pointers into the last entry of each hash bucket */
    for (hashIdx = (1 << hashLog); hashIdx; ) {
        U32 const bucketIdx = --hashIdx << ZSTD_LAZY_DDSS_BUCKET_LOG;
        U32 const chainPackedPointer = tmpHashTable[hashIdx];
        U32 i;
        for (i = 0; i < cacheSize; i++) {
            hashTable[bucketIdx + i] = 0;
        }
        hashTable[bucketIdx + bucketSize - 1] = chainPackedPointer;
    }

    /* fill the buckets of the hash table */
    for (idx = ms->nextToUpdate; idx < target; idx++) {
        U32 const h = (U32)ZSTD_hashPtr(base + idx, hashLog, ms->cParams.minMatch)
                   << ZSTD_LAZY_DDSS_BUCKET_LOG;
        U32 i;
        /* Shift hash cache down 1. */
        for (i = cacheSize - 1; i; i--)
            hashTable[h + i] = hashTable[h + i - 1];
        hashTable[h] = idx;
    }

    ms->nextToUpdate = target;
}